

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Emb_Obj_t * Emb_ManPerformBfs(Emb_Man_t *p,Vec_Int_t *vThis,Vec_Int_t *vNext,Emb_Dat_t *pDist)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Vec_Int_t *p_00;
  ulong uVar6;
  int iVar7;
  float fVar8;
  
  iVar7 = vThis->nSize;
  if (iVar7 < 1) {
    __assert_fail("Vec_IntSize(vThis) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3a7,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  iVar5 = 0;
  do {
    p_00 = vNext;
    p->nDistMax = iVar5;
    if (iVar7 < 1) {
      if (p_00->nSize < 1) {
        __assert_fail("Vec_IntSize(vNext) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x3c0,
                      "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                     );
      }
      uVar2 = Vec_IntEntry(p_00,0);
      if ((pDist != (Emb_Dat_t *)0x0) &&
         ((fVar8 = (float)(p->nDistMax + -1),
          pDist[(((Emb_Obj_t *)(p->pObjData + uVar2))->field_8).Value] != fVar8 ||
          (NAN(pDist[(((Emb_Obj_t *)(p->pObjData + uVar2))->field_8).Value]) || NAN(fVar8))))) {
        __assert_fail("pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x3c2,
                      "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                     );
      }
      return (Emb_Obj_t *)(p->pObjData + uVar2);
    }
    p->nReached = p->nReached + iVar7;
    p_00->nSize = 0;
    for (iVar7 = 0; iVar7 < vThis->nSize; iVar7 = iVar7 + 1) {
      uVar2 = Vec_IntEntry(vThis,iVar7);
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + uVar2);
      if (pDist != (Emb_Dat_t *)0x0) {
        pDist[puVar1[4]] = (float)p->nDistMax;
      }
      for (uVar6 = 0; uVar6 < *puVar1 >> 4; uVar6 = uVar6 + 1) {
        lVar3 = (long)(int)puVar1[uVar6 + 5];
        if (puVar1[3 - lVar3] != p->nTravIds) {
          puVar1[3 - lVar3] = p->nTravIds;
          Vec_IntPush(p_00,puVar1[2 - lVar3]);
        }
      }
      for (lVar3 = 0; (int)lVar3 < (int)puVar1[1]; lVar3 = lVar3 + 1) {
        lVar4 = (long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar3 + 5];
        if (puVar1[lVar4 + 3] != p->nTravIds) {
          puVar1[lVar4 + 3] = p->nTravIds;
          Vec_IntPush(p_00,puVar1[lVar4 + 2]);
        }
      }
    }
    iVar5 = p->nDistMax + 1;
    iVar7 = p_00->nSize;
    vNext = vThis;
    vThis = p_00;
  } while( true );
}

Assistant:

Emb_Obj_t * Emb_ManPerformBfs( Emb_Man_t * p, Vec_Int_t * vThis, Vec_Int_t * vNext, Emb_Dat_t * pDist )
{
    Vec_Int_t * vTemp;
    Emb_Obj_t * pThis, * pNext, * pResult;
    int i, k;
    assert( Vec_IntSize(vThis) > 0 );
    for ( p->nDistMax = 0; Vec_IntSize(vThis) > 0; p->nDistMax++ )
    {
        p->nReached += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            if ( pDist ) pDist[pThis->Value] = p->nDistMax;
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    assert( Vec_IntSize(vNext) > 0 );
    pResult = Emb_ManObj( p, Vec_IntEntry(vNext, 0) );
    assert( pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1 );
    return pResult;
}